

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::Own<kj::AppendableFile>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryAppendFile
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  _func_int **pp_Var1;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> MVar2;
  undefined4 in_register_0000000c;
  long lVar3;
  AppendableFile *pAVar4;
  AppendableFile *extraout_RDX;
  AppendableFile *extraout_RDX_00;
  _func_int **pp_Var6;
  AppendableFile *extraout_RDX_01;
  AppendableFile *extraout_RDX_02;
  WriteMode in_R8D;
  Exception *this_00;
  Maybe<kj::Own<kj::AppendableFile>_> MVar7;
  Maybe<kj::Own<const_kj::Directory>_> MVar8;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  undefined1 local_50 [16];
  FsNode local_40;
  Disposer local_38;
  AppendableFile *pAVar5;
  
  lVar3 = CONCAT44(in_register_0000000c,mode);
  pAVar4 = (AppendableFile *)path.parts.size_;
  name_00.content.ptr = (Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)path.parts.ptr
  ;
  if (lVar3 == 1) {
    this_00 = (Exception *)&name_00.content.ptr[1].ptr;
    kj::_::Mutex::lock((Mutex *)this_00,EXCLUSIVE);
    local_50._8_8_ = name_00.content.ptr + 3;
    pp_Var1 = (pAVar4->super_OutputStream)._vptr_OutputStream;
    if (pp_Var1 == (_func_int **)0x0) {
      pp_Var6 = (_func_int **)0x4f5114;
    }
    else {
      pp_Var6 = (pAVar4->super_FsNode)._vptr_FsNode;
    }
    name.content.size_ = (long)pp_Var1 + (ulong)(pp_Var1 == (_func_int **)0x0);
    name.content.ptr = (char *)pp_Var6;
    local_50._0_8_ = this_00;
    MVar2 = Impl::openEntry((Impl *)local_50._8_8_,name,in_R8D);
    if (MVar2.ptr == (EntryImpl *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      asFile((InMemoryDirectory *)&stack0xffffffffffffffc0,name_00.content.ptr,(EntryImpl *)local_50
             ,(WriteMode)MVar2.ptr);
      MVar7 = Maybe<kj::Own<const_kj::File>_>::
              map<kj::Own<kj::AppendableFile>_(&)(kj::Own<const_kj::File>)>
                        ((Maybe<kj::Own<const_kj::File>_> *)this,
                         (_func_Own<kj::AppendableFile>_Own<const_kj::File> *)
                         &stack0xffffffffffffffc0);
      pAVar5 = MVar7.ptr.ptr;
      if (local_38._vptr_Disposer != (_func_int **)0x0) {
        local_38._vptr_Disposer = (_func_int **)0x0;
        (**(code **)*local_40._vptr_FsNode)();
        pAVar5 = extraout_RDX_00;
      }
      this_00 = (Exception *)local_50._0_8_;
      if ((Exception *)local_50._0_8_ == (Exception *)0x0) goto LAB_00498b9b;
    }
    kj::_::Mutex::unlock((Mutex *)this_00,EXCLUSIVE);
    pAVar5 = extraout_RDX_02;
    goto LAB_00498b9b;
  }
  if (lVar3 == 0) {
    if ((in_R8D & MODIFY) == 0) {
      pAVar5 = pAVar4;
      if ((in_R8D & CREATE) != 0) goto LAB_00498b83;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4bd,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                ((Fault *)local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4b9,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    kj::_::Debug::Fault::~Fault((Fault *)local_50);
    pAVar5 = extraout_RDX;
  }
  else {
    pp_Var1 = (pAVar4->super_OutputStream)._vptr_OutputStream;
    if (pp_Var1 == (_func_int **)0x0) {
      pp_Var6 = (_func_int **)0x4f5114;
    }
    else {
      pp_Var6 = (pAVar4->super_FsNode)._vptr_FsNode;
    }
    name_00.content.size_ = (size_t)pp_Var6;
    MVar8 = tryGetParent((InMemoryDirectory *)local_50,name_00,
                         (int)pp_Var1 + (uint)(pp_Var1 == (_func_int **)0x0));
    pAVar5 = (AppendableFile *)MVar8.ptr.ptr;
    if ((_func_int **)local_50._8_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_50._8_8_ + 0x80))
                (this,local_50._8_8_,&pAVar4[1].super_OutputStream,lVar3 + -1,in_R8D);
      (**(code **)(((String *)local_50._0_8_)->content).ptr)
                (local_50._0_8_,local_50._8_8_ + *(long *)(*(_func_int **)local_50._8_8_ + -0x10));
      pAVar5 = extraout_RDX_01;
      goto LAB_00498b9b;
    }
LAB_00498b83:
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  }
LAB_00498b9b:
  MVar7.ptr.ptr = pAVar5;
  MVar7.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::AppendableFile>_>)MVar7.ptr;
}

Assistant:

Maybe<Own<AppendableFile>> tryAppendFile(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        KJ_FAIL_REQUIRE("not a file") { return nullptr; }
      } else if (has(mode, WriteMode::CREATE)) {
        return nullptr;  // already exists (as a directory)
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return nullptr; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(path[0], mode)) {
        return asFile(lock, *entry, mode).map(newFileAppender);
      } else {
        return nullptr;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->tryAppendFile(path.slice(1, path.size()), mode);
      } else {
        return nullptr;
      }
    }
  }